

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O1

int gost_digests(ENGINE *e,EVP_MD **digest,int **nids,int nid)

{
  int iVar1;
  long lVar2;
  EVP_MD *pEVar3;
  
  if (digest == (EVP_MD **)0x0) {
    *nids = known_digest_nids;
    lVar2 = 0;
    do {
      *(undefined4 *)((long)known_digest_nids + lVar2) =
           *(undefined4 *)(*(long *)((long)gost_digest_array + lVar2 * 2) + 8);
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x20);
    iVar1 = 8;
  }
  else {
    lVar2 = 0;
    do {
      if (gost_digest_array[lVar2]->nid == nid) {
        pEVar3 = GOST_init_digest(gost_digest_array[lVar2]);
        iVar1 = 1;
        goto LAB_0010e23f;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    pEVar3 = (EVP_MD *)0x0;
    iVar1 = 0;
LAB_0010e23f:
    *digest = pEVar3;
  }
  return iVar1;
}

Assistant:

static int gost_digests(ENGINE *e, const EVP_MD **digest,
                        const int **nids, int nid)
{
    int i;

    if (!digest) {
        int *n = known_digest_nids;

        *nids = n;
        for (i = 0; i < OSSL_NELEM(gost_digest_array); i++)
            *n++ = gost_digest_array[i]->nid;
        return i;
    }

    for (i = 0; i < OSSL_NELEM(gost_digest_array); i++)
        if (nid == gost_digest_array[i]->nid) {
            *digest = GOST_init_digest(gost_digest_array[i]);
            return 1;
        }
    *digest = NULL;
    return 0;
}